

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_calc_iframe_target_size_one_pass_cbr(AV1_COMP *cpi)

{
  double dVar1;
  int iVar2;
  AV1_COMP *in_RDI;
  double dVar3;
  double framerate;
  int kf_boost;
  int64_t target;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  int local_4c;
  byte local_44;
  int local_34;
  int local_24;
  int64_t local_20;
  
  if ((in_RDI->common).current_frame.frame_number == 0) {
    if ((in_RDI->ppi->p_rc).starting_buffer_level / 2 < 0x80000000) {
      local_34 = (int)((in_RDI->ppi->p_rc).starting_buffer_level / 2);
    }
    else {
      local_34 = 0x7fffffff;
    }
    local_20 = (int64_t)local_34;
    if ((1 < (in_RDI->svc).number_temporal_layers) && (local_20 < 0x1fffffff)) {
      if ((in_RDI->svc).number_temporal_layers + -1 < 3) {
        local_44 = (char)(in_RDI->svc).number_temporal_layers - 1;
      }
      else {
        local_44 = 2;
      }
      local_20 = local_20 << (local_44 & 0x3f);
    }
  }
  else {
    dVar1 = in_RDI->framerate;
    dVar3 = round(dVar1 + dVar1 + -16.0);
    if ((int)dVar3 < 0x20) {
      local_4c = 0x20;
    }
    else {
      dVar3 = round(dVar1 + dVar1 + -16.0);
      local_4c = (int)dVar3;
    }
    local_24 = local_4c;
    if ((double)(in_RDI->rc).frames_since_key < dVar1 / 2.0) {
      local_24 = (int)((double)(local_4c * (in_RDI->rc).frames_since_key) / (dVar1 / 2.0));
    }
    local_20 = (long)(local_24 + 0x10) * (long)(in_RDI->rc).avg_frame_bandwidth >> 4;
  }
  iVar2 = clamp_iframe_target_size(in_RDI,local_20);
  return iVar2;
}

Assistant:

int av1_calc_iframe_target_size_one_pass_cbr(const AV1_COMP *cpi) {
  const RATE_CONTROL *rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *p_rc = &cpi->ppi->p_rc;
  int64_t target;
  if (cpi->common.current_frame.frame_number == 0) {
    target = ((p_rc->starting_buffer_level / 2) > INT_MAX)
                 ? INT_MAX
                 : (int)(p_rc->starting_buffer_level / 2);
    if (cpi->svc.number_temporal_layers > 1 && target < (INT_MAX >> 2)) {
      target = target << AOMMIN(2, (cpi->svc.number_temporal_layers - 1));
    }
  } else {
    int kf_boost = 32;
    double framerate = cpi->framerate;

    kf_boost = AOMMAX(kf_boost, (int)round(2 * framerate - 16));
    if (rc->frames_since_key < framerate / 2) {
      kf_boost = (int)(kf_boost * rc->frames_since_key / (framerate / 2));
    }
    target = ((int64_t)(16 + kf_boost) * rc->avg_frame_bandwidth) >> 4;
  }
  return clamp_iframe_target_size(cpi, target);
}